

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundAnalysisPreprocessing.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::CoreMLModels::SoundAnalysisPreprocessing::SoundAnalysisPreprocessing
          (SoundAnalysisPreprocessing *this,SoundAnalysisPreprocessing *from)

{
  SoundAnalysisPreprocessingTypeCase SVar1;
  InternalMetadataWithArenaLite *this_00;
  SoundAnalysisPreprocessing_Vggish *this_01;
  SoundAnalysisPreprocessing_Vggish *from_00;
  SoundAnalysisPreprocessing *from_local;
  SoundAnalysisPreprocessing *this_local;
  Container *local_20;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__SoundAnalysisPreprocessing_0062fb00;
  google::protobuf::internal::InternalMetadataWithArenaLite::InternalMetadataWithArenaLite
            (&this->_internal_metadata_,(Arena *)0x0);
  SoundAnalysisPreprocessingTypeUnion::SoundAnalysisPreprocessingTypeUnion
            ((SoundAnalysisPreprocessingTypeUnion *)&this->SoundAnalysisPreprocessingType_);
  this->_cached_size_ = 0;
  this_00 = &from->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ).ptr_ & 1) == 1) {
      local_20 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                           ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)this_00);
    }
    else {
      local_20 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArenaLite::
                 default_instance_abi_cxx11_();
    }
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,&local_20->unknown_fields);
  }
  clear_has_SoundAnalysisPreprocessingType(this);
  SVar1 = SoundAnalysisPreprocessingType_case(from);
  if ((SVar1 != SOUNDANALYSISPREPROCESSINGTYPE_NOT_SET) && (SVar1 == kVggish)) {
    this_01 = mutable_vggish(this);
    from_00 = vggish(from);
    SoundAnalysisPreprocessing_Vggish::MergeFrom(this_01,from_00);
  }
  return;
}

Assistant:

SoundAnalysisPreprocessing::SoundAnalysisPreprocessing(const SoundAnalysisPreprocessing& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  clear_has_SoundAnalysisPreprocessingType();
  switch (from.SoundAnalysisPreprocessingType_case()) {
    case kVggish: {
      mutable_vggish()->::CoreML::Specification::CoreMLModels::SoundAnalysisPreprocessing_Vggish::MergeFrom(from.vggish());
      break;
    }
    case SOUNDANALYSISPREPROCESSINGTYPE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.CoreMLModels.SoundAnalysisPreprocessing)
}